

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O1

_Bool find_value_arg(char *value_name,char *string,size_t nstring,int *num)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *tc;
  char *local_30;
  
  pcVar1 = strchr(value_name,0x5b);
  if (pcVar1 != (char *)0x0) {
    if (string == (char *)0x0) {
      if ((num != (int *)0x0) &&
         (lVar3 = strtol(pcVar1 + 1,&local_30,10),
         lVar3 + 0x7fffffffU >> 1 < 0x7fffffff && *local_30 == ']')) {
        *num = (int)lVar3;
        goto LAB_00138902;
      }
    }
    else {
      __s = pcVar1 + 1;
      pcVar2 = strchr(__s,0x5d);
      if ((pcVar2 != (char *)0x0) && ((ulong)((long)pcVar2 - (long)pcVar1) <= nstring)) {
        memcpy(string,__s,(long)pcVar2 - (long)__s);
        string[(long)pcVar2 - (long)__s] = '\0';
LAB_00138902:
        *pcVar1 = '\0';
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool find_value_arg(char *value_name, char *string, size_t nstring,
		int *num)
{
	/* Find the first bracket */
	char *to = strchr(value_name, '[');

	if (!to) {
		return false;
	}

	/* Choose random_value value or int or fail */
	if (string) {
		/* Find the closing bracket. */
		char *tc = strchr(to + 1, ']');

		if (!tc || (size_t)(tc - to) > nstring) {
			return false;
		}
		/* Get the dice */
		memcpy(string, to + 1, tc - (to + 1));
		string[tc - (to + 1)] = '\0';
	} else if (num) {
		/* Get the value */
		char *tc;
		long lv = strtol(to + 1, &tc, 10);

		/*
		 * Also reject INT_MIN and INT_MAX so don't have to check errno
		 * to detect overflow when sizeof(long) == sizeof(int).
		 */
		if (*tc != ']' || lv <= INT_MIN || lv >= INT_MAX) {
			return false;
		}
		*num = (int)lv;
	} else {
		return false;
	}

	/*
	 * Put a null where the opening bracket is; make it easier for the
	 * caller to handle the name.
	 */
	*to = '\0';

	/* Success */
	return true;
}